

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

int64_t flatbuffers::GetAnyValueI(BaseType type,uint8_t *data)

{
  int *piVar1;
  int64_t iVar2;
  uint8_t *__nptr;
  char *endptr;
  uint8_t *local_20;
  
  switch(type) {
  case UType:
  case Bool:
  case UByte:
    return (ulong)*data;
  case Byte:
    return (long)(char)*data;
  case Short:
    return (long)*(short *)data;
  case UShort:
    return (ulong)*(ushort *)data;
  case Int:
    return (long)*(int *)data;
  case UInt:
    return (ulong)*(uint *)data;
  case Long:
  case ULong:
    return *(int64_t *)data;
  case Float:
    return (long)*(float *)data;
  case Double:
    return (long)*(double *)data;
  case String:
    break;
  default:
    return 0;
  }
  __nptr = data + (ulong)*(uint *)data + 4;
  piVar1 = __errno_location();
  *piVar1 = 0;
  local_20 = __nptr;
  iVar2 = strtoll_l((char *)__nptr,(char **)&local_20,10,ClassicLocale::instance_);
  if (((local_20 == __nptr) || (*local_20 != '\0')) || (*piVar1 != 0)) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int64_t GetAnyValueI(reflection::BaseType type, const uint8_t *data) {
  // clang-format off
  #define FLATBUFFERS_GET(T) static_cast<int64_t>(ReadScalar<T>(data))
  switch (type) {
    case reflection::UType:
    case reflection::Bool:
    case reflection::UByte:  return FLATBUFFERS_GET(uint8_t);
    case reflection::Byte:   return FLATBUFFERS_GET(int8_t);
    case reflection::Short:  return FLATBUFFERS_GET(int16_t);
    case reflection::UShort: return FLATBUFFERS_GET(uint16_t);
    case reflection::Int:    return FLATBUFFERS_GET(int32_t);
    case reflection::UInt:   return FLATBUFFERS_GET(uint32_t);
    case reflection::Long:   return FLATBUFFERS_GET(int64_t);
    case reflection::ULong:  return FLATBUFFERS_GET(uint64_t);
    case reflection::Float:  return FLATBUFFERS_GET(float);
    case reflection::Double: return FLATBUFFERS_GET(double);
    case reflection::String: {
      auto s = reinterpret_cast<const String *>(ReadScalar<uoffset_t>(data) +
                                                data);
      return s ? StringToInt(s->c_str()) : 0;
    }
    default: return 0;  // Tables & vectors do not make sense.
  }
  #undef FLATBUFFERS_GET
  // clang-format on
}